

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceD.cpp
# Opt level: O2

ostream * operator<<(ostream *os,SequenceD<64> *t_seq)

{
  string local_30;
  
  SequenceD<64>::as_char_string_abi_cxx11_(&local_30,t_seq);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SequenceD<64> &t_seq) {
    os << t_seq.as_char_string();
    return os;
}